

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

double r8_hyper_2f1(double a,double b,double c,double x)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double local_100;
  
  if (c < 0.0) {
    if (((double)(int)c == c) && (!NAN((double)(int)c) && !NAN(c))) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"R8_HYPER_2F1 - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  The hypergeometric series is divergent.\n");
      std::operator<<((ostream *)&std::cerr,"  C is integral and negative.\n");
      poVar5 = std::operator<<((ostream *)&std::cerr,"  C = ");
      x = c;
      goto LAB_001c899c;
    }
  }
  dVar23 = 1.0;
  dVar21 = 1.0 - x;
  dVar22 = c - a;
  dVar25 = dVar22 - b;
  if ((1e-15 <= dVar21) || (0.0 < dVar25)) {
    if ((((b != 0.0) || (NAN(b))) && ((a != 0.0 || (NAN(a))))) && ((x != 0.0 || (NAN(x))))) {
      dVar24 = c - b;
      dVar23 = *(double *)(&DAT_0021f690 + (ulong)(0.95 < x) * 8);
      if ((dVar25 <= 0.0) || ((dVar21 != dVar23 || (NAN(dVar21) || NAN(dVar23))))) {
        if ((dVar23 < x + 1.0) || (dVar23 < ABS(dVar22 + b + -1.0))) {
          if ((double)(int)a == a && a < 0.0 || 0.0 > b && (double)(int)b == b) {
            dVar23 = ABS(b);
            if (0.0 <= b || (double)(int)b != b) {
              dVar23 = ABS(a);
            }
            iVar3 = 0;
            if (0 < (int)dVar23) {
              iVar3 = (int)dVar23;
            }
            dVar23 = 1.0;
            dVar22 = 1.0;
            dVar21 = 1.0;
            while (bVar10 = iVar3 != 0, iVar3 = iVar3 + -1, bVar10) {
              dVar21 = (((dVar22 + b + -1.0) * dVar21 * (dVar22 + a + -1.0)) /
                       ((dVar22 + c + -1.0) * dVar22)) * x;
              dVar23 = dVar23 + dVar21;
              dVar22 = dVar22 + 1.0;
            }
            return dVar23;
          }
          if (dVar22 <= 0.0 && (double)(int)dVar22 == dVar22 ||
              (double)(int)dVar24 == dVar24 && 0.0 >= dVar24) {
            dVar23 = dVar24;
            if ((double)(int)dVar24 != dVar24 || 0.0 < dVar24) {
              dVar23 = dVar22;
            }
            iVar3 = 0;
            if (0 < (int)ABS(dVar23)) {
              iVar3 = (int)ABS(dVar23);
            }
            dVar23 = 1.0;
            dVar20 = 1.0;
            dVar26 = 1.0;
            while (bVar10 = iVar3 != 0, iVar3 = iVar3 + -1, bVar10) {
              dVar26 = (((dVar24 + dVar20 + -1.0) * dVar26 * (dVar22 + dVar20 + -1.0)) /
                       ((dVar20 + c + -1.0) * dVar20)) * x;
              dVar23 = dVar23 + dVar26;
              dVar20 = dVar20 + 1.0;
            }
            dVar22 = pow(dVar21,dVar25);
            return dVar23 * dVar22;
          }
          dVar20 = b;
          dVar25 = x;
          if ((((0.0 <= x) || (dVar25 = x / (x + -1.0), dVar20 = dVar24, c <= a)) || (a <= b)) ||
             (b <= 0.0)) {
            b = a;
            dVar22 = dVar20;
          }
          if (0.75 <= dVar25) {
            dVar13 = c - b;
            dVar27 = dVar13 - dVar22;
            dVar24 = (double)(int)dVar27;
            dVar20 = tgamma(b);
            dVar26 = tgamma(dVar22);
            dVar17 = tgamma(c);
            if (1e-15 <= ABS(dVar27 - dVar24)) {
              dVar24 = tgamma(dVar13);
              dVar11 = tgamma(c - dVar22);
              dVar16 = tgamma(dVar27);
              dVar1 = (dVar22 + b) - c;
              dVar15 = tgamma(dVar1);
              dVar11 = (dVar16 * dVar17) / (dVar11 * dVar24);
              dVar25 = 1.0 - dVar25;
              dVar24 = pow(dVar25,dVar27);
              dVar24 = dVar24 * ((dVar15 * dVar17) / (dVar20 * dVar26));
              dVar26 = 0.0;
              dVar17 = dVar11;
              dVar20 = dVar24;
              for (uVar9 = 1; dVar16 = dVar26, uVar9 != 0xfb; uVar9 = uVar9 + 1) {
                dVar16 = (double)(int)uVar9;
                dVar17 = (((dVar22 + dVar16 + -1.0) * dVar17 * (b + dVar16 + -1.0)) /
                         ((dVar1 + dVar16) * dVar16)) * dVar25;
                dVar20 = ((((c - dVar22) + dVar16 + -1.0) * dVar20 * (dVar13 + dVar16 + -1.0)) /
                         ((dVar27 + dVar16) * dVar16)) * dVar25;
                dVar16 = dVar26 + dVar17 + dVar20;
                if (ABS(dVar16 - dVar26) < ABS(dVar16) * dVar23) break;
                dVar26 = dVar16;
              }
              dVar24 = dVar24 + dVar11 + dVar16;
            }
            else {
              uVar7 = (uint)dVar27;
              dVar27 = tgamma(b + dVar24);
              dVar11 = tgamma(dVar22 + dVar24);
              dVar16 = r8_psi(b);
              dVar1 = r8_psi(dVar22);
              dVar13 = 0.0;
              if (uVar7 != 0) {
                dVar13 = 1.0;
              }
              uVar8 = -uVar7;
              uVar9 = uVar7;
              if ((int)uVar7 < 1) {
                uVar9 = uVar8;
              }
              dVar15 = 1.0;
              for (uVar6 = 1; uVar6 < uVar9; uVar6 = uVar6 + 1) {
                dVar13 = dVar13 * dVar15;
                dVar15 = dVar15 + 1.0;
              }
              dVar15 = 1.0;
              dVar18 = 1.0;
              while (bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
                dVar18 = dVar18 * dVar15;
                dVar15 = dVar15 + 1.0;
              }
              if ((int)uVar7 < 0) {
                dVar25 = 1.0 - dVar25;
                dVar2 = (double)(int)uVar8;
                dVar24 = pow(dVar25,dVar2);
                dVar15 = pow(-1.0,dVar2);
                dVar12 = 1.0;
                dVar19 = 1.0;
                dVar14 = 1.0;
                for (iVar3 = 1; uVar7 + iVar3 != 0; iVar3 = iVar3 + 1) {
                  dVar14 = ((((dVar22 - dVar2) + dVar12 + -1.0) *
                            dVar14 * ((b - dVar2) + dVar12 + -1.0)) /
                           (double)(int)((uVar7 + iVar3) * iVar3)) * dVar25;
                  dVar19 = dVar19 + dVar14;
                  dVar12 = dVar12 + 1.0;
                }
                uVar6 = 0;
                if ((int)uVar7 < 0) {
                  uVar6 = uVar8;
                }
                dVar2 = 0.0;
                dVar14 = 1.0;
                uVar9 = uVar6;
                while (bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
                  dVar2 = dVar2 + 1.0 / dVar14;
                  dVar14 = dVar14 + 1.0;
                }
                local_100 = (dVar13 * dVar17) / (dVar24 * dVar20 * dVar26);
                dVar20 = (-dVar15 * dVar17) / (dVar27 * dVar11 * dVar18);
                dVar24 = log(dVar25);
                dVar26 = 0.0;
                iVar3 = 2;
                dVar17 = 1.0;
                dVar24 = dVar24 + ((dVar16 + dVar1) - dVar2) + 1.1544313298030657;
                for (uVar9 = 1; dVar13 = dVar24, uVar9 != 0xfb; uVar9 = uVar9 + 1) {
                  dVar13 = (double)(int)uVar9;
                  dVar15 = b + dVar13 + -1.0;
                  dVar11 = dVar22 + dVar13 + -1.0;
                  dVar27 = 0.0;
                  uVar8 = uVar6;
                  iVar4 = iVar3;
                  while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
                    dVar27 = dVar27 + 1.0 / (double)iVar4;
                    iVar4 = iVar4 + 1;
                  }
                  dVar26 = dVar26 + (1.0 - b) / (dVar15 * dVar13) +
                           (1.0 - dVar22) / (dVar13 * dVar11);
                  dVar13 = log(dVar25);
                  dVar17 = ((dVar11 * dVar17 * dVar15) / (double)(int)((uVar9 - uVar7) * uVar9)) *
                           dVar25;
                  dVar13 = (dVar13 + ((dVar16 + dVar1 + 1.1544313298030657 + dVar26) - dVar27)) *
                           dVar17 + dVar24;
                  if (ABS(dVar13 - dVar24) < ABS(dVar13) * dVar23) break;
                  iVar3 = iVar3 + 1;
                  dVar24 = dVar13;
                }
              }
              else {
                local_100 = (dVar17 * dVar13) / (dVar27 * dVar11);
                dVar13 = pow(dVar25 + -1.0,dVar24);
                dVar25 = 1.0 - dVar25;
                dVar27 = 1.0;
                dVar19 = 1.0;
                dVar11 = 1.0;
                for (iVar3 = 1; iVar3 < (int)uVar7; iVar3 = iVar3 + 1) {
                  dVar11 = (((dVar22 + dVar27 + -1.0) * dVar11 * (b + dVar27 + -1.0)) /
                           (double)(int)((uVar8 + iVar3) * iVar3)) * dVar25;
                  dVar19 = dVar19 + dVar11;
                  dVar27 = dVar27 + 1.0;
                }
                dVar11 = 0.0;
                dVar27 = 1.0;
                uVar9 = uVar7;
                while (bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
                  dVar11 = -1.0 / dVar27 +
                           1.0 / (dVar22 + dVar27 + -1.0) + dVar11 + 1.0 / (b + dVar27 + -1.0);
                  dVar27 = dVar27 + 1.0;
                }
                dVar20 = (dVar13 * -dVar17) / (dVar20 * dVar26 * dVar18);
                dVar26 = log(dVar25);
                dVar27 = 0.0;
                iVar3 = 2;
                dVar17 = 1.0;
                dVar26 = dVar26 + dVar11 + dVar16 + dVar1 + 1.1544313298030657;
                for (uVar9 = 1; dVar13 = dVar26, uVar9 != 0xfb; uVar9 = uVar9 + 1) {
                  dVar15 = (double)(int)uVar9;
                  dVar13 = 0.0;
                  dVar11 = 1.0;
                  uVar8 = uVar7;
                  iVar4 = iVar3;
                  while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
                    dVar13 = dVar13 + (1.0 - b) / ((b + dVar11 + dVar15 + -1.0) * (double)iVar4) +
                             1.0 / (dVar22 + dVar11 + dVar15 + -1.0);
                    dVar11 = dVar11 + 1.0;
                    iVar4 = iVar4 + 1;
                  }
                  dVar27 = dVar27 + (1.0 - b) / ((b + dVar15 + -1.0) * dVar15) +
                           (1.0 - dVar22) / ((dVar22 + dVar15 + -1.0) * dVar15);
                  dVar11 = log(dVar25);
                  dVar17 = (((dVar15 + dVar22 + dVar24 + -1.0) *
                            dVar17 * (b + dVar24 + dVar15 + -1.0)) /
                           (double)(int)((uVar9 + uVar7) * uVar9)) * dVar25;
                  dVar13 = (dVar11 + dVar16 + dVar1 + 1.1544313298030657 + dVar27 + dVar13) * dVar17
                           + dVar26;
                  if (ABS(dVar13 - dVar26) < ABS(dVar13) * dVar23) break;
                  iVar3 = iVar3 + 1;
                  dVar26 = dVar13;
                }
              }
              dVar24 = dVar19 * local_100 + dVar20 * dVar13;
            }
          }
          else {
            if (((dVar22 + dVar22 <= c) || (c <= dVar22)) || ((c <= b || (b + b <= c)))) {
              dVar24 = 1.0;
            }
            else {
              b = c - b;
              dVar24 = pow(1.0 - dVar25,b - dVar22);
              dVar22 = c - dVar22;
            }
            dVar26 = 1.0;
            dVar20 = 1.0;
            for (uVar9 = 1; dVar17 = dVar20, uVar9 != 0xfb; uVar9 = uVar9 + 1) {
              dVar17 = (double)(int)uVar9;
              dVar26 = (((dVar22 + dVar17 + -1.0) * dVar26 * (b + dVar17 + -1.0)) /
                       ((dVar17 + c + -1.0) * dVar17)) * dVar25;
              dVar17 = dVar20 + dVar26;
              if (ABS(dVar17 - dVar20) <= ABS(dVar17) * dVar23) break;
              dVar20 = dVar17;
            }
            dVar24 = dVar24 * dVar17;
          }
          if (x < 0.0) {
            dVar23 = pow(dVar21,a);
            dVar24 = dVar24 * (1.0 / dVar23);
          }
          if (uVar9 < 0x79) {
            return dVar24;
          }
          std::operator<<((ostream *)&std::cout,"\n");
          std::operator<<((ostream *)&std::cout,"R8_HYPER_2F1 - Warning!\n");
          std::operator<<((ostream *)&std::cout,"  A large number of iterations were needed.\n");
          std::operator<<((ostream *)&std::cout,"  The accuracy of the results should be checked.\n"
                         );
          return dVar24;
        }
        dVar21 = exp2(-a);
        dVar23 = tgamma(c);
        dVar25 = tgamma((a * 0.5 + 1.0) - b);
        dVar22 = tgamma(a * 0.5 + 0.5);
        dVar23 = dVar23 * dVar21 * 1.7724538509055159;
        dVar22 = dVar22 * dVar25;
      }
      else {
        dVar21 = tgamma(c);
        dVar23 = tgamma(dVar25);
        dVar25 = tgamma(dVar22);
        dVar22 = tgamma(dVar24);
        dVar23 = dVar23 * dVar21;
        dVar22 = dVar22 * dVar25;
      }
      dVar23 = dVar23 / dVar22;
    }
    return dVar23;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"R8_HYPER_2F1 - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  The hypergeometric series is divergent.\n");
  std::operator<<((ostream *)&std::cerr,"  1 - X < 0, C - A - B <= 0\n");
  poVar5 = std::operator<<((ostream *)&std::cerr,"  A = ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,a);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<((ostream *)&std::cerr,"  B = ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,b);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<((ostream *)&std::cerr,"  C = ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,c);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<((ostream *)&std::cerr,"  X = ");
LAB_001c899c:
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,x);
  std::operator<<(poVar5,"\n");
  exit(1);
}

Assistant:

double r8_hyper_2f1 ( double a, double b, double c, double x )

//****************************************************************************80
//
//  Purpose:
//
//    R8_HYPER_2F1 evaluates the hypergeometric function F(A,B,C,X).
//
//  Discussion:
//
//    A minor bug was corrected.  The HW variable, used in several places as
//    the "old" value of a quantity being iteratively improved, was not
//    being initialized.  JVB, 11 February 2008.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 July 2009
//
//  Author:
//
//    Original FORTRAN77 original by Shanjie Zhang, Jianming Jin.
//    C++ version by John Burkardt.
//
//    The original FORTRAN77 version of this routine is copyrighted by
//    Shanjie Zhang and Jianming Jin.  However, they give permission to
//    incorporate this routine into a user program provided that the copyright
//    is acknowledged.
//
//  Reference:
//
//    Shanjie Zhang, Jianming Jin,
//    Computation of Special Functions,
//    Wiley, 1996,
//    ISBN: 0-471-11963-6,
//    LC: QA351.C45
//
//  Parameters:
//
//    Input, double A, B, C, X, the arguments of the function.
//    C must not be equal to a nonpositive integer.
//    X < 1.
//
//    Output, double R8_HYPER_2F1, the value of the function.
//
{
  double a0;
  double aa;
  double bb;
  double c0;
  double c1;
  double el = 0.5772156649015329;
  double eps;
  double f0;
  double f1;
  double g0;
  double g1;
  double g2;
  double g3;
  double ga;
  double gabc;
  double gam;
  double gb;
  double gbm;
  double gc;
  double gca;
  double gcab;
  double gcb;
  double gm;
  double hf;
  double hw;
  int j;
  int k;
  bool l0;
  bool l1;
  bool l2;
  bool l3;
  bool l4;
  bool l5;
  int m;
  int nm;
  double pa;
  double pb;
  const double r8_pi = 3.141592653589793;
  double r;
  double r0;
  double r1;
  double rm;
  double rp;
  double sm;
  double sp;
  double sp0;
  double x1;

  l0 = ( c == int( c ) ) && ( c < 0.0 );
  l1 = ( 1.0 - x < 1.0E-15 ) && ( c - a - b <= 0.0 );
  l2 = ( a == int( a ) ) && ( a < 0.0 );
  l3 = ( b == int( b ) ) && ( b < 0.0 );
  l4 = ( c - a == int( c - a ) ) && ( c - a <= 0.0 );
  l5 = ( c - b == int( c - b ) ) && ( c - b <= 0.0 );

  if ( l0 )
  {
    std::cerr << "\n";
    std::cerr << "R8_HYPER_2F1 - Fatal error!\n";
    std::cerr << "  The hypergeometric series is divergent.\n";
    std::cerr << "  C is integral and negative.\n";
    std::cerr << "  C = " << c << "\n";
    exit ( 1 );
  }

  if ( l1 )
  {
    std::cerr << "\n";
    std::cerr << "R8_HYPER_2F1 - Fatal error!\n";
    std::cerr << "  The hypergeometric series is divergent.\n";
    std::cerr << "  1 - X < 0, C - A - B <= 0\n";
    std::cerr << "  A = " << a << "\n";
    std::cerr << "  B = " << b << "\n";
    std::cerr << "  C = " << c << "\n";
    std::cerr << "  X = " << x << "\n";
    exit ( 1 );
  }

  if ( 0.95 < x )
  {
    eps = 1.0E-08;
  }
  else
  {
    eps = 1.0E-15;
  }

  if ( x == 0.0 || a == 0.0 || b == 0.0 )
  {
    hf = 1.0;
    return hf;
  }
  else if ( 1.0 - x == eps && 0.0 < c - a - b )
  {
    gc = tgamma ( c );
    gcab = tgamma ( c - a - b );
    gca = tgamma ( c - a );
    gcb = tgamma ( c - b );
    hf = gc * gcab / ( gca * gcb );
    return hf;
  }
  else if ( 1.0 + x <= eps && fabs ( c - a + b - 1.0 ) <= eps )
  {
    g0 = sqrt ( r8_pi ) * pow ( 2.0, - a );
    g1 = tgamma ( c );
    g2 = tgamma ( 1.0 + a / 2.0 - b );
    g3 = tgamma ( 0.5 + 0.5 * a );
    hf = g0 * g1 / ( g2 * g3 );
    return hf;
  }
  else if ( l2 || l3 )
  {
    if ( l2 )
    {
      nm = int( fabs ( a ) );
    }

    if ( l3 )
    {
      nm = int( fabs ( b ) );
    }

    hf = 1.0;
    r = 1.0;

    for ( k = 1; k <= nm; k++ )
    {
      r = r * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
        / ( k * ( c + k - 1.0 ) ) * x;
      hf = hf + r;
    }

    return hf;
  }
  else if ( l4 || l5 )
  {
    if ( l4 )
    {
      nm = int( fabs ( c - a ) );
    }

    if ( l5 )
    {
      nm = int( fabs ( c - b ) );
    }

    hf = 1.0;
    r  = 1.0;
    for ( k = 1; k <= nm; k++ )
    {
      r = r * ( c - a + k - 1.0 ) * ( c - b + k - 1.0 ) 
        / ( k * ( c + k - 1.0 ) ) * x;
      hf = hf + r;
    }
    hf = pow ( 1.0 - x, c - a - b ) * hf;
    return hf;
  }

  aa = a;
  bb = b;
  x1 = x;

  if ( x < 0.0 )
  {
    x = x / ( x - 1.0 );
    if ( a < c && b < a && 0.0 < b )
    {
      a = bb;
      b = aa;
    }
    b = c - b;
  }

  if ( 0.75 <= x )
  {
    gm = 0.0;

    if ( fabs ( c - a - b - int( c - a - b ) ) < 1.0E-15 )
    {
      m = int( c - a - b );
      ga = tgamma ( a );
      gb = tgamma ( b );
      gc = tgamma ( c );
      gam = tgamma ( a + m );
      gbm = tgamma ( b + m );

      pa = r8_psi ( a );
      pb = r8_psi ( b );

      if ( m != 0 )
      {
        gm = 1.0;
      }

      for ( j = 1; j <= std::abs ( m ) - 1; j++ )
      {
        gm = gm * j;
      }

      rm = 1.0;
      for ( j = 1; j <= std::abs ( m ); j++ )
      {
        rm = rm * j;
      }

      f0 = 1.0;
      r0 = 1.0;;
      r1 = 1.0;
      sp0 = 0.0;;
      sp = 0.0;

      if ( 0 <= m )
      {
        c0 = gm * gc / ( gam * gbm );
        c1 = - gc * pow ( x - 1.0, m ) / ( ga * gb * rm );

        for ( k = 1; k <= m - 1; k++ )
        {
          r0 = r0 * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
            / ( k * ( k - m ) ) * ( 1.0 - x );
          f0 = f0 + r0;
        }

        for ( k = 1; k <= m; k++ )
        {
          sp0 = sp0 + 1.0 / ( a + k - 1.0 ) + 1.0 / ( b + k - 1.0 ) 
          - 1.0 / double( k );
        }

        f1 = pa + pb + sp0 + 2.0 * el + log ( 1.0 - x );
        hw = f1;

        for ( k = 1; k <= 250; k++ )
        {
          sp = sp + ( 1.0 - a ) / ( k * ( a + k - 1.0 ) ) 
            + ( 1.0 - b ) / ( k * ( b + k - 1.0 ) );

          sm = 0.0;
          for ( j = 1; j <= m; j++ )
          {
            sm = sm + ( 1.0 - a ) 
              / ( ( j + k ) * ( a + j + k - 1.0 ) ) 
              + 1.0 / ( b + j + k - 1.0 );
          }

          rp = pa + pb + 2.0 * el + sp + sm + log ( 1.0 - x );

          r1 = r1 * ( a + m + k - 1.0 ) * ( b + m + k - 1.0 ) 
            / ( k * ( m + k ) ) * ( 1.0 - x );

          f1 = f1 + r1 * rp;

          if ( fabs ( f1 - hw ) < fabs ( f1 ) * eps )
          {
            break;
          }
          hw = f1;
        }
        hf = f0 * c0 + f1 * c1;
      }
      else if ( m < 0 )
      {
        m = - m;
        c0 = gm * gc / ( ga * gb * pow ( 1.0 - x, m ) );
        c1 = - pow ( - 1.0, m ) * gc / ( gam * gbm * rm );

        for ( k = 1; k <= m - 1; k++ )
        {
          r0 = r0 * ( a - m + k - 1.0 ) * ( b - m + k - 1.0 ) 
            / ( k * ( k - m ) ) * ( 1.0 - x );
          f0 = f0 + r0;
        }

        for ( k = 1; k <= m; k++ )
        {
          sp0 = sp0 + 1.0 / double( k );
        }

        f1 = pa + pb - sp0 + 2.0 * el + log ( 1.0 - x );
        hw = f1;

        for ( k = 1; k <= 250; k++ )
        {
          sp = sp + ( 1.0 - a ) 
            / ( k * ( a + k - 1.0 ) ) 
            + ( 1.0 - b ) / ( k * ( b + k - 1.0 ) );

          sm = 0.0;
          for ( j = 1; j <= m; j++ )
          {
            sm = sm + 1.0 / double( j + k );
          }

          rp = pa + pb + 2.0 * el + sp - sm + log ( 1.0 - x );

          r1 = r1 * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
            / ( k * ( m + k ) ) * ( 1.0 - x );

          f1 = f1 + r1 * rp;

          if ( fabs ( f1 - hw ) < fabs ( f1 ) * eps )
          {
            break;
          }

          hw = f1;
        }

        hf = f0 * c0 + f1 * c1;
      }
    }
    else
    {
      ga = tgamma ( a );
      gb = tgamma ( b );
      gc = tgamma ( c );
      gca = tgamma ( c - a );
      gcb = tgamma ( c - b );
      gcab = tgamma ( c - a - b );
      gabc = tgamma ( a + b - c );
      c0 = gc * gcab / ( gca * gcb );
      c1 = gc * gabc / ( ga * gb ) * pow ( 1.0 - x, c - a - b );
      hf = 0.0;
      hw = hf;
      r0 = c0;
      r1 = c1;

      for ( k = 1; k <= 250; k++ )
      {
        r0 = r0 * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
          / ( k * ( a + b - c + k ) ) * ( 1.0 - x );

        r1 = r1 * ( c - a + k - 1.0 ) * ( c - b + k - 1.0 ) 
          / ( k * ( c - a - b + k ) ) * ( 1.0 - x );

        hf = hf + r0 + r1;

        if ( fabs ( hf - hw ) < fabs ( hf ) * eps )
        {
          break;
        }
        hw = hf;
      }
      hf = hf + c0 + c1;
    }
  }
  else
  {
    a0 = 1.0;

    if ( a < c && c < 2.0 * a && b < c && c < 2.0 * b )
    {
      a0 = pow ( 1.0 - x, c - a - b );
      a = c - a;
      b = c - b;
    }

    hf = 1.0;
    hw = hf;
    r = 1.0;

    for ( k = 1; k <= 250; k++ )
    {
      r = r * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
        / ( k * ( c + k - 1.0 ) ) * x;

      hf = hf + r;

      if ( fabs ( hf - hw ) <= fabs ( hf ) * eps )
      {
        break;
      }

      hw = hf;
    }
    hf = a0 * hf;
  }

  if ( x1 < 0.0 )
  {
    x = x1;
    c0 = 1.0 / pow ( 1.0 - x, aa );
    hf = c0 * hf;
  }

  a = aa;
  b = bb;

  if ( 120 < k )
  {
    std::cout << "\n";
    std::cout << "R8_HYPER_2F1 - Warning!\n";
    std::cout << "  A large number of iterations were needed.\n";
    std::cout << "  The accuracy of the results should be checked.\n";
  }

  return hf;
}